

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# temp.cpp
# Opt level: O1

void __thiscall Pathie::TempEntry::TempEntry(TempEntry *this,string *namepart)

{
  Path *this_00;
  bool bVar1;
  int iVar2;
  __pid_t _Var3;
  ostream *poVar4;
  string local_218;
  Path local_1f8;
  Path local_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  this->_vptr_TempEntry = (_func_int **)&PTR__TempEntry_00113c90;
  this->m_keep = false;
  this_00 = &this->m_path;
  Path::Path(this_00);
  do {
    Path::temp_dir();
    std::__cxx11::stringstream::stringstream(local_1b8);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_1a8,(namepart->_M_dataplus)._M_p,namepart->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"-",1);
    time((time_t *)0x0);
    poVar4 = std::ostream::_M_insert<long>((long)poVar4);
    iVar2 = rand();
    std::ostream::operator<<((ostream *)poVar4,iVar2);
    _Var3 = getpid();
    std::ostream::operator<<((ostream *)local_1a8,_Var3);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream(local_1b8);
    Path::operator/(&local_1d8,&local_1f8,&local_218);
    Path::operator=(this_00,&local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8.m_path._M_dataplus._M_p != &local_1d8.m_path.field_2) {
      operator_delete(local_1d8.m_path._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_path._M_dataplus._M_p != &local_1f8.m_path.field_2) {
      operator_delete(local_1f8.m_path._M_dataplus._M_p);
    }
    bVar1 = Path::exists(this_00);
  } while (bVar1);
  return;
}

Assistant:

TempEntry::TempEntry(std::string namepart)
  : m_keep(false)
{
  do {
    m_path = Path::temp_dir() / generate_random_filename(namepart);
  } while (m_path.exists());
}